

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlPopOutputCallbacks(void)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((xmlOutputCallbackInitialized == '\x01') && (0 < xmlOutputCallbackNr)) {
    uVar1 = xmlOutputCallbackNr - 1;
    xmlOutputCallbackNr = uVar1;
    xmlOutputCallbackTable[uVar1].matchcallback = (xmlOutputMatchCallback)0x0;
    xmlOutputCallbackTable[uVar1].opencallback = (xmlOutputOpenCallback)0x0;
    xmlOutputCallbackTable[uVar1].writecallback = (xmlOutputWriteCallback)0x0;
    xmlOutputCallbackTable[uVar1].closecallback = (xmlOutputCloseCallback)0x0;
  }
  return uVar1;
}

Assistant:

int
xmlPopOutputCallbacks(void)
{
    if (!xmlOutputCallbackInitialized)
        return(-1);

    if (xmlOutputCallbackNr <= 0)
        return(-1);

    xmlOutputCallbackNr--;
    xmlOutputCallbackTable[xmlOutputCallbackNr].matchcallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].opencallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].writecallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].closecallback = NULL;

    return(xmlOutputCallbackNr);
}